

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Genome::AddSequence(Genome *this,string *seq)

{
  length_error *this_00;
  long *plVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (seq->_M_string_length ==
      (long)(((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1)) {
    std::__cxx11::string::_M_assign((string *)&(this->super_Polymer).polymerases_.seq_);
    std::__cxx11::string::_M_assign((string *)&this->seq_);
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_80,seq->_M_string_length);
  std::operator+(&local_60,"Provided sequence is not the correct size. ",&local_80);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_c0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_c0._M_dataplus._M_p == psVar2) {
    local_c0.field_2._M_allocated_capacity = *psVar2;
    local_c0.field_2._8_8_ = plVar1[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar2;
  }
  local_c0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string
            (&local_a0,((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1);
  std::operator+(&local_40,&local_c0,&local_a0);
  std::length_error::length_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void Genome::AddSequence(const std::string &seq) {
  if (seq.size() != (stop_ - start_ + 1)) { //start_ should always be 1
    throw std::length_error("Provided sequence is not the correct size. " +
                            std::to_string(seq.size()) + " " +
                            std::to_string(stop_ - start_ + 1));
  }
  polymerases_.set_sequence(seq);
  seq_ = seq;
}